

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

p_ply_property_conflict ply_find_property(p_ply_element element,char *name)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  char *in_RSI;
  long in_RDI;
  int nproperties;
  int i;
  p_ply_property_conflict property;
  int local_24;
  
  lVar1 = *(long *)(in_RDI + 0x108);
  uVar2 = *(undefined8 *)(in_RDI + 0x110);
  local_24 = 0;
  while( true ) {
    if ((int)uVar2 <= local_24) {
      return (p_ply_property_conflict)0x0;
    }
    iVar3 = strcmp((char *)(lVar1 + (long)local_24 * 0x128),in_RSI);
    if (iVar3 == 0) break;
    local_24 = local_24 + 1;
  }
  return (p_ply_property_conflict)(lVar1 + (long)local_24 * 0x128);
}

Assistant:

static p_ply_property ply_find_property(p_ply_element element,
                                        const char *name) {
    p_ply_property property;
    int i, nproperties;
    assert(element && name);
    property = element->property;
    nproperties = element->nproperties;
    assert(property || nproperties == 0);
    assert(!property || nproperties > 0);
    for (i = 0; i < nproperties; i++)
        if (!strcmp(property[i].name, name)) return &property[i];
    return NULL;
}